

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

uint __thiscall jpgd::jpeg_decoder::get_bits(jpeg_decoder *this,int num_bits)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (num_bits == 0) {
    return 0;
  }
  uVar7 = this->m_bit_buf;
  uVar6 = uVar7 >> (-(byte)num_bits & 0x1f);
  iVar4 = this->m_bits_left;
  this->m_bits_left = iVar4 - num_bits;
  if (iVar4 - num_bits != 0 && num_bits <= iVar4) {
    this->m_bit_buf = uVar7 << ((byte)num_bits & 0x1f);
    return uVar6;
  }
  this->m_bit_buf = uVar7 << ((byte)iVar4 & 0x1f);
  iVar4 = this->m_in_buf_left;
  if (iVar4 == 0) {
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 != 0) goto LAB_001dae93;
    uVar5 = this->m_tem_flag;
    this->m_tem_flag = uVar5 ^ 1;
    uVar7 = 0xd9;
    if (uVar5 == 0) {
      uVar7 = 0xff;
    }
LAB_001daed7:
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 == 0) {
      uVar2 = this->m_tem_flag;
      this->m_tem_flag = uVar2 ^ 1;
      uVar5 = 0xd9;
      if (uVar2 == 0) {
        uVar5 = 0xff;
      }
      goto LAB_001daf08;
    }
  }
  else {
LAB_001dae93:
    pbVar3 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = pbVar3 + 1;
    uVar7 = (uint)*pbVar3;
    iVar4 = iVar4 + -1;
    this->m_in_buf_left = iVar4;
    if (iVar4 == 0) goto LAB_001daed7;
  }
  pbVar3 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = pbVar3 + 1;
  bVar1 = *pbVar3;
  this->m_in_buf_left = iVar4 + -1;
  uVar5 = (uint)bVar1;
LAB_001daf08:
  iVar4 = this->m_bits_left;
  this->m_bit_buf =
       (uVar7 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar5) <<
       (-(char)iVar4 & 0x1fU);
  this->m_bits_left = iVar4 + 0x10;
  if (-0x11 < iVar4) {
    return uVar6;
  }
  __assert_fail("m_bits_left >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                ,0x1bc,"uint jpgd::jpeg_decoder::get_bits(int)");
}

Assistant:

inline uint jpeg_decoder::get_bits(int num_bits)
	{
		if (!num_bits)
			return 0;

		uint i = m_bit_buf >> (32 - num_bits);

		if ((m_bits_left -= num_bits) <= 0)
		{
			m_bit_buf <<= (num_bits += m_bits_left);

			uint c1 = get_char();
			uint c2 = get_char();
			m_bit_buf = (m_bit_buf & 0xFFFF0000) | (c1 << 8) | c2;

			m_bit_buf <<= -m_bits_left;

			m_bits_left += 16;

			assert(m_bits_left >= 0);
		}
		else
			m_bit_buf <<= num_bits;

		return i;
	}